

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StableBlockVector.hpp
# Opt level: O0

void __thiscall
gmlc::containers::StableBlockVector<helics::Publication,_5U,_std::allocator<helics::Publication>_>::
StableBlockVector(StableBlockVector<helics::Publication,_5U,_std::allocator<helics::Publication>_>
                  *this)

{
  StableBlockVector<helics::Publication,_5U,_std::allocator<helics::Publication>_> *this_local;
  
  this->csize = 0;
  this->dataptr = (Publication **)0x0;
  this->dataSlotsAvailable = 0;
  this->dataSlotIndex = 0;
  this->bsize = 0x20;
  this->freeSlotsAvailable = 0;
  this->freeIndex = 0;
  this->freeblocks = (Publication **)0x0;
  return;
}

Assistant:

StableBlockVector() noexcept {}